

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracer.cpp
# Opt level: O2

RGB __thiscall RayTracer::processPixel(RayTracer *this,Segment *ray,int recursionLevel)

{
  RGB RVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  undefined1 local_50 [8];
  pair<int,_Point> sphereIntersection;
  pair<int,_Point> planeIntersection;
  
  _local_50 = findClosestIntersection<Sphere>(&(this->super_RayTracerBase).config.spheres,ray);
  uVar2 = local_50._0_4_;
  join_0x00001200_0x00000000_ =
       findClosestIntersection<Plane>(&(this->super_RayTracerBase).config.planes,ray);
  if ((uVar2 & (uint)sphereIntersection.second.y) == 0xffffffff) {
    RVar1.r = '\0';
    RVar1.g = '\0';
    RVar1.b = '\0';
    return RVar1;
  }
  if (uVar2 == 0xffffffff || sphereIntersection.second.y == -NAN) {
    if (uVar2 == 0xffffffff) {
LAB_00106209:
      RVar1 = processPixelOnPlane(this,&ray->a,(Point *)&sphereIntersection.second.z,
                                  (this->super_RayTracerBase).config.planes.
                                  super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
                                  super__Vector_impl_data._M_start +
                                  (int)sphereIntersection.second.y,recursionLevel);
      return RVar1;
    }
  }
  else {
    fVar3 = distance(&ray->a,(Point *)(local_50 + 4));
    fVar4 = distance(&ray->a,(Point *)&sphereIntersection.second.z);
    if (fVar4 <= fVar3) {
      goto LAB_00106209;
    }
    uVar2 = local_50._0_4_;
  }
  RVar1 = processPixelOnSphere
                    (this,&ray->a,(Point *)(local_50 + 4),
                     (this->super_RayTracerBase).config.spheres.
                     super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                     super__Vector_impl_data._M_start + (int)uVar2,recursionLevel);
  return RVar1;
}

Assistant:

RGB RayTracer::processPixel(Segment const& ray, int recursionLevel)
{
  std::pair<int, Point> sphereIntersection = findClosestIntersection(config.spheres, ray);
  std::pair<int, Point> planeIntersection = findClosestIntersection(config.planes, ray);

  if (sphereIntersection.first == -1 && planeIntersection.first == -1)
    return processPixelOnBackground();

  auto closerIntersectionCmp = [&ray](std::pair<int, Point> const& i1,
                                      std::pair<int, Point> const& i2) {
    if (i1.first != -1 && i2.first != -1)
      return distance(ray.a, i1.second) < distance(ray.a, i2.second);
    return i1.first != -1;
  };

  if (closerIntersectionCmp(sphereIntersection, planeIntersection))
    return processPixelOnSphere(ray.a, sphereIntersection.second,
                                config.spheres.cbegin() + sphereIntersection.first, recursionLevel);
  else
    return processPixelOnPlane(ray.a, planeIntersection.second,
                               config.planes.cbegin() + planeIntersection.first, recursionLevel);
}